

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<long_double>_>::Diagonal(TPZMatrix<Fad<long_double>_> *this,Fad<long_double> *val)

{
  Fad<long_double> *pFVar1;
  int64_t iVar2;
  int64_t iVar3;
  undefined8 in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t col;
  int64_t row;
  char *in_stack_00000148;
  char *in_stack_00000150;
  Fad<long_double> *this_00;
  double *x;
  Fad<long_double> *this_01;
  double local_58 [7];
  Fad<long_double> *local_20;
  Fad<long_double> *local_18;
  
  iVar2 = TPZBaseMatrix::Cols(in_RDI);
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar2 != iVar3) {
    Error(in_stack_00000150,in_stack_00000148);
  }
  for (local_18 = (Fad<long_double> *)0x0; pFVar1 = local_18, iVar2 = TPZBaseMatrix::Rows(in_RDI),
      (long)pFVar1 < iVar2; local_18 = (Fad<long_double> *)((long)&local_18->val_ + 1)) {
    local_20 = (Fad<long_double> *)0x0;
    while (this_01 = local_20, iVar2 = TPZBaseMatrix::Cols(in_RDI), pFVar1 = local_18,
          (long)this_01 < iVar2) {
      if (local_18 == local_20) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_18,local_20,in_RSI);
      }
      else {
        x = local_58;
        this_00 = local_20;
        Fad<long_double>::Fad<double,_nullptr>(this_01,x);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,pFVar1,this_00,x);
        Fad<long_double>::~Fad(this_00);
      }
      local_20 = (Fad<long_double> *)((long)&local_20->val_ + 1);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}